

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-x86_64.c
# Opt level: O2

void va_block_arg_builtin(void *res,void *p,size_t s,uint64_t ncase)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  void *__src;
  anon_union_8_2_94730066 u [2];
  undefined8 local_28;
  undefined8 local_20;
  
  __src = *(void **)((long)p + 8);
  if (ncase - 3 < 2) {
    uVar1 = *(uint *)((long)p + 4);
    if ((0xa0 < uVar1) || (uVar2 = *p, 0x28 < uVar2)) goto LAB_0011c637;
    uVar3 = uVar1;
    if (ncase == 3) {
      uVar3 = uVar2;
    }
    uVar4 = uVar2;
    if (ncase == 3) {
      uVar4 = uVar1;
    }
    local_28 = *(undefined8 *)(*(long *)((long)p + 0x10) + (ulong)uVar3);
    local_20 = *(undefined8 *)(*(long *)((long)p + 0x10) + (ulong)uVar4);
    *(uint *)((long)p + 4) = uVar1 + 8;
    *(uint *)p = uVar2 + 8;
  }
  else {
    uVar5 = s + 7 & 0xfffffffffffffff8;
    if (ncase != 2) {
      if (ncase == 1) {
        uVar1 = *p;
        if (uVar5 + uVar1 < 0x31) {
          local_28 = *(undefined8 *)(*(long *)((long)p + 0x10) + (ulong)uVar1);
          *(uint *)p = uVar1 + 8;
          if (8 < uVar5) {
            local_20 = *(undefined8 *)(*(long *)((long)p + 0x10) + (ulong)(uVar1 + 8));
            *(uint *)p = uVar1 + 0x10;
          }
          goto LAB_0011c6be;
        }
      }
LAB_0011c637:
      if (res != (void *)0x0) {
        memcpy(res,__src,s);
        __src = *(void **)((long)p + 8);
      }
      *(size_t *)((long)p + 8) = (long)__src + (s + 7 & 0xfffffffffffffff8);
      return;
    }
    uVar1 = *(uint *)((long)p + 4);
    local_28 = *(undefined8 *)(*(long *)((long)p + 0x10) + (ulong)uVar1);
    *(uint *)((long)p + 4) = uVar1 + 0x10;
    if (8 < uVar5) {
      local_20 = *(undefined8 *)(*(long *)((long)p + 0x10) + (ulong)(uVar1 + 0x10));
      *(uint *)((long)p + 4) = uVar1 + 0x20;
    }
  }
LAB_0011c6be:
  if (res != (void *)0x0) {
    memcpy(res,&local_28,s);
  }
  return;
}

Assistant:

void va_block_arg_builtin (void *res, void *p, size_t s, uint64_t ncase) {
  struct x86_64_va_list *va = p;
  size_t size = ((s + 7) / 8) * 8;
  void *a = va->overflow_arg_area;
  union {
    uint64_t i;
    double d;
  } u[2];

  switch (ncase) {
  case 1:
    if (va->gp_offset + size > 48) break;
    u[0].i = *(uint64_t *) ((char *) va->reg_save_area + va->gp_offset);
    va->gp_offset += 8;
    if (size > 8) {
      u[1].i = *(uint64_t *) ((char *) va->reg_save_area + va->gp_offset);
      va->gp_offset += 8;
    }
    if (res != NULL) memcpy (res, &u, s);
    return;
  case 2:
    u[0].d = *(double *) ((char *) va->reg_save_area + va->fp_offset);
    va->fp_offset += 16;
    if (size > 8) {
      u[1].d = *(double *) ((char *) va->reg_save_area + va->fp_offset);
      va->fp_offset += 16;
    }
    if (res != NULL) memcpy (res, &u, s);
    return;
  case 3:
  case 4:
    if (va->fp_offset > 160 || va->gp_offset > 40) break;
    if (ncase == 3) {
      u[0].i = *(uint64_t *) ((char *) va->reg_save_area + va->gp_offset);
      u[1].d = *(double *) ((char *) va->reg_save_area + va->fp_offset);
    } else {
      u[0].d = *(double *) ((char *) va->reg_save_area + va->fp_offset);
      u[1].i = *(uint64_t *) ((char *) va->reg_save_area + va->gp_offset);
    }
    va->fp_offset += 8;
    va->gp_offset += 8;
    if (res != NULL) memcpy (res, &u, s);
    return;
  default: break;
  }
  if (res != NULL) memcpy (res, a, s);
  va->overflow_arg_area += size / 8;
}